

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

void duckdb::TimeBucketOffsetFunction<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  BucketWidthType BVar2;
  reference a;
  reference b;
  reference c;
  NotImplementedException *this;
  idx_t count;
  code *fun;
  interval_t in_stack_ffffffffffffffa8;
  
  a = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  b = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  c = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
  if (a->vector_type == CONSTANT_VECTOR) {
    puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
      return;
    }
    BVar2 = TimeBucket::ClassifyBucketWidth(in_stack_ffffffffffffffa8);
    if (BVar2 != UNCLASSIFIED) {
      if (BVar2 == CONVERTIBLE_TO_MONTHS) {
        count = args->count;
        fun = TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
              Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
      }
      else {
        if (BVar2 != CONVERTIBLE_TO_MICROS) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffb0,
                     "Bucket type not implemented for TIME_BUCKET",
                     (allocator *)&stack0xffffffffffffffaf);
          NotImplementedException::NotImplementedException(this,(string *)&stack0xffffffffffffffb0);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        count = args->count;
        fun = TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
              Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
      }
      goto LAB_01d7c4d7;
    }
  }
  count = args->count;
  fun = TimeBucket::OffsetTernaryOperator::
        Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
LAB_01d7c4d7:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
            (a,b,c,result,count,fun);
  return;
}

Assistant:

static void TimeBucketOffsetFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &offset_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::Execute<interval_t, T, interval_t, T>(
		    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
		    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
	}
}